

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O0

void check_text(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  StringRef capturedExpression;
  int iVar1;
  ExprLhs<const_int_&> this;
  long lVar2;
  undefined8 *in_RDX;
  undefined8 in_RDI;
  int i;
  int len;
  char *str;
  AssertionHandler catchAssertionHandler;
  undefined4 in_stack_fffffffffffffef8;
  Flags in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff00;
  AssertionHandler *this_00;
  StringRef *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int iVar3;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int *in_stack_ffffffffffffff30;
  AssertionHandler local_80;
  undefined8 *local_18;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_80.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 (in_stack_ffffffffffffff00,
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  this_00 = &local_80;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
             ,0x34);
  Catch::StringRef::StringRef
            ((StringRef *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (char *)in_stack_ffffffffffffff08);
  capturedExpression.m_size._0_4_ = in_stack_ffffffffffffff20;
  capturedExpression.m_start = (char *)in_stack_ffffffffffffff18;
  capturedExpression.m_size._4_4_ = in_stack_ffffffffffffff24;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08,(SourceLineInfo *)this_00,capturedExpression,
             in_stack_fffffffffffffefc);
  this = Catch::Decomposer::operator<=
                   ((Decomposer *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                    (int *)0x22c03d);
  Catch::ExprLhs<int_const&>::operator==
            ((ExprLhs<const_int_&> *)this.m_lhs,in_stack_ffffffffffffff30);
  Catch::AssertionHandler::handleExpr
            (this_00,(ITransientExpression *)
                     CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
            ((BinaryExpr<const_int_&,_const_int_&> *)0x22c08a);
  Catch::AssertionHandler::complete(this_00);
  Catch::AssertionHandler::~AssertionHandler(this_00);
  lVar2 = duckdb_shell_sqlite3_value_text(*local_18);
  iVar1 = duckdb_shell_sqlite3_value_bytes(*local_18);
  for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
    *(undefined1 *)(lVar2 + iVar3) = 0x54;
  }
  duckdb_shell_sqlite3_result_text(local_8,lVar2,iVar1,0);
  return;
}

Assistant:

static void check_text(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE(argc == 1);
	char *str = (char *)sqlite3_value_text(argv[0]);
	int len = sqlite3_value_bytes(argv[0]);
	for (int i = 0; i < len; ++i) {
		str[i] = 'T';
	}
	sqlite3_result_text(context, str, len, nullptr);
}